

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_0::readPixels(Functions *gl,Surface *screen)

{
  int width;
  int height;
  void *data;
  TextureFormat local_50;
  PixelBufferAccess local_48;
  
  width = screen->m_width;
  height = screen->m_height;
  local_50.order = RGBA;
  local_50.type = UNORM_INT8;
  data = (void *)(screen->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (screen->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_48,&local_50,width,height,1,data);
  (*(code *)gl)(0,0,width,height,0x1908,0x1401,local_48.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void readPixels (const glw::Functions& gl, tcu::Surface* screen)
{
	gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(),  GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
}